

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

_Bool array_bitset_container_intersect(array_container_t *src_1,bitset_container_t *src_2)

{
  int iVar1;
  _Bool _Var2;
  int local_28;
  uint16_t key;
  int i;
  int32_t origcard;
  bitset_container_t *src_2_local;
  array_container_t *src_1_local;
  
  iVar1 = src_1->cardinality;
  local_28 = 0;
  while( true ) {
    if (iVar1 <= local_28) {
      return false;
    }
    _Var2 = bitset_container_contains(src_2,src_1->array[local_28]);
    if (_Var2) break;
    local_28 = local_28 + 1;
  }
  return true;
}

Assistant:

bool array_bitset_container_intersect(const array_container_t *src_1,
                                         const bitset_container_t *src_2) {
	const int32_t origcard = src_1->cardinality;
	for (int i = 0; i < origcard; ++i) {
	        uint16_t key = src_1->array[i];
	        if(bitset_container_contains(src_2, key)) return true;
	}
	return false;
}